

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::SegmentInfo::Parse(SegmentInfo *this)

{
  long lVar1;
  longlong lVar2;
  double rollover_check;
  long status_4;
  long status_3;
  long status_2;
  long status_1;
  long status;
  longlong size;
  longlong id;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  SegmentInfo *this_local;
  
  pReader = (IMkvReader *)this;
  if (this->m_pMuxingAppAsUTF8 != (char *)0x0) {
    __assert_fail("m_pMuxingAppAsUTF8 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xf93,"long mkvparser::SegmentInfo::Parse()");
  }
  if (this->m_pWritingAppAsUTF8 != (char *)0x0) {
    __assert_fail("m_pWritingAppAsUTF8 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xf94,"long mkvparser::SegmentInfo::Parse()");
  }
  if (this->m_pTitleAsUTF8 != (char *)0x0) {
    __assert_fail("m_pTitleAsUTF8 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xf95,"long mkvparser::SegmentInfo::Parse()");
  }
  pos = (longlong)this->m_pSegment->m_pReader;
  stop = this->m_start;
  id = this->m_start + this->m_size;
  this->m_timecodeScale = 1000000;
  this->m_duration = -1.0;
  do {
    if (id <= stop) {
      if (9.223372036854776e+18 < this->m_duration * (double)this->m_timecodeScale) {
        return -2;
      }
      if (stop != id) {
        return -2;
      }
      return 0;
    }
    lVar1 = ParseElementHeader((IMkvReader *)pos,&stop,id,&size,&status);
    if (lVar1 < 0) {
      return lVar1;
    }
    if (size == 0x2ad7b1) {
      lVar2 = UnserializeUInt((IMkvReader *)pos,stop,status);
      this->m_timecodeScale = lVar2;
      if (this->m_timecodeScale < 1) {
        return -2;
      }
    }
    else if (size == 0x4489) {
      lVar1 = UnserializeFloat((IMkvReader *)pos,stop,status,&this->m_duration);
      if (lVar1 < 0) {
        return lVar1;
      }
      if (this->m_duration <= 0.0 && this->m_duration != 0.0) {
        return -2;
      }
    }
    else {
      if (size == 0x4d80) {
        lVar1 = UnserializeString((IMkvReader *)pos,stop,status,&this->m_pMuxingAppAsUTF8);
      }
      else if (size == 0x5741) {
        lVar1 = UnserializeString((IMkvReader *)pos,stop,status,&this->m_pWritingAppAsUTF8);
      }
      else {
        if (size != 0x7ba9) goto LAB_00111d33;
        lVar1 = UnserializeString((IMkvReader *)pos,stop,status,&this->m_pTitleAsUTF8);
      }
      if (lVar1 != 0) {
        return lVar1;
      }
    }
LAB_00111d33:
    stop = status + stop;
    if (id < stop) {
      return -2;
    }
  } while( true );
}

Assistant:

long SegmentInfo::Parse() {
  assert(m_pMuxingAppAsUTF8 == NULL);
  assert(m_pWritingAppAsUTF8 == NULL);
  assert(m_pTitleAsUTF8 == NULL);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  m_timecodeScale = 1000000;
  m_duration = -1;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvTimecodeScale) {
      m_timecodeScale = UnserializeUInt(pReader, pos, size);

      if (m_timecodeScale <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDuration) {
      const long status = UnserializeFloat(pReader, pos, size, m_duration);

      if (status < 0)
        return status;

      if (m_duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvMuxingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pMuxingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvWritingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pWritingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTitle) {
      const long status = UnserializeString(pReader, pos, size, m_pTitleAsUTF8);

      if (status)
        return status;
    }

    pos += size;

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  const double rollover_check = m_duration * m_timecodeScale;
  if (rollover_check > static_cast<double>(LLONG_MAX))
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}